

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::joinString
          (Interpreter *this,bool *first,UString *running,Value *sep,uint idx,Value *elt)

{
  pointer pFVar1;
  ostream *poVar2;
  RuntimeError *__return_storage_ptr__;
  Value *v;
  string local_1d0;
  stringstream ss;
  ostream local_1a0 [376];
  
  if (elt->t == NULL_TYPE) {
    return;
  }
  if (elt->t == STRING) {
    if (*first == false) {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      append(running,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)((sep->v).h + 1));
    }
    *first = false;
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    append(running,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   ((elt->v).h + 1));
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_1a0,"expected string but arr[");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"] was ");
  (anonymous_namespace)::type_str_abi_cxx11_(&local_1d0,(_anonymous_namespace_ *)elt,v);
  std::operator<<(poVar2,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
  pFVar1 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::stringbuf::str();
  Stack::makeError(__return_storage_ptr__,&this->stack,&pFVar1[-1].location,&local_1d0);
  __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

void joinString(bool &first, UString &running, const Value &sep, unsigned idx, const Value &elt)
    {
        if (elt.t == Value::NULL_TYPE) {
            return;
        }
        if (elt.t != Value::STRING) {
            std::stringstream ss;
            ss << "expected string but arr[" << idx << "] was " << type_str(elt);
            throw makeError(stack.top().location, ss.str());
        }
        if (!first) {
            running.append(static_cast<HeapString *>(sep.v.h)->value);
        }
        first = false;
        running.append(static_cast<HeapString *>(elt.v.h)->value);
    }